

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Socket.cpp
# Opt level: O3

Address __thiscall Socket::getLocalAddress(Socket *this)

{
  int iVar1;
  SocketError *this_00;
  socklen_t localAddressLength;
  Address address;
  socklen_t local_54;
  Address local_50;
  string local_40;
  
  local_54 = 0x10;
  iVar1 = getsockname(this->socketDescriptor,(sockaddr *)&local_50,&local_54);
  if (iVar1 != -1) {
    return local_50;
  }
  this_00 = (SocketError *)__cxa_allocate_exception(0x30);
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_40,"Socket error: could not get address of assigned socket!","");
  SocketError::SocketError(this_00,&local_40,0);
  __cxa_throw(this_00,&SocketError::typeinfo,SocketError::~SocketError);
}

Assistant:

Address Socket::getLocalAddress(){
    Address address;
    socklen_t localAddressLength = sizeof(address);
    if (getsockname(socketDescriptor,(struct sockaddr *) &address, &localAddressLength) == -1) {
        throw SocketError("Socket error: could not get address of assigned socket!");
    }
    else{
        return address;
    }
}